

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

FExecList * C_ParseExecFile(char *file,FExecList *exec)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  char cmd [4096];
  undefined8 uStack_1040;
  char local_1038 [4104];
  
  uStack_1040 = 0x47dc4b;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    uStack_1040 = 0x47dd7b;
    Printf("Could not open \"%s\"\n",file);
  }
  else {
    uStack_1040 = 0x47dc6a;
    pcVar5 = fgets(local_1038,0xfff,__stream);
    if (pcVar5 != (char *)0x0) {
      do {
        uStack_1040 = 0x47dc86;
        sVar6 = strlen(local_1038);
        if (local_1038[sVar6 - 1] == '\n') {
          local_1038[sVar6 - 1] = '\0';
          lVar9 = (long)&uStack_1040 + 6;
        }
        else {
          lVar9 = (long)&uStack_1040 + 7;
        }
        pcVar7 = (char *)(lVar9 + sVar6);
        bVar10 = local_1038 < pcVar7;
        pcVar5 = local_1038;
        if (bVar10) {
          lVar9 = (long)pcVar7 - (long)local_1038;
          bVar2 = false;
          pcVar1 = local_1038;
          do {
            pcVar8 = pcVar1 + 1;
            if (*pcVar1 == '\"') {
              bVar2 = (bool)(bVar2 ^ 1);
            }
            else {
              bVar3 = !bVar2;
              bVar2 = true;
              if (((bVar3) && (bVar2 = false, *pcVar1 == '/')) && (pcVar5 = pcVar1, *pcVar8 == '/'))
              break;
            }
            bVar10 = pcVar8 < pcVar7;
            lVar9 = lVar9 + -1;
            pcVar5 = pcVar7;
            pcVar1 = pcVar8;
          } while (lVar9 != 0);
        }
        if (pcVar5 != local_1038) {
          if (bVar10) {
            *pcVar5 = '\0';
          }
          if (exec == (FExecList *)0x0) {
            uStack_1040 = 0x47dd05;
            exec = (FExecList *)operator_new(0x20);
            (exec->Commands).Array = (FString *)0x0;
            (exec->Commands).Most = 0;
            (exec->Commands).Count = 0;
            (exec->Pullins).Array = (FString *)0x0;
            (exec->Pullins).Most = 0;
            (exec->Pullins).Count = 0;
          }
          uStack_1040 = 0x47dd20;
          FExecList::AddCommand(exec,local_1038,file);
        }
        uStack_1040 = 0x47dd30;
        pcVar5 = fgets(local_1038,0xfff,__stream);
      } while (pcVar5 != (char *)0x0);
    }
    uStack_1040 = 0x47dd4b;
    iVar4 = feof(__stream);
    if (iVar4 == 0) {
      uStack_1040 = 0x47dd60;
      Printf("Error parsing \"%s\"\n",file);
    }
    uStack_1040 = 0x47dd68;
    fclose(__stream);
  }
  return exec;
}

Assistant:

FExecList *C_ParseExecFile(const char *file, FExecList *exec)
{
	FILE *f;
	char cmd[4096];
	int retval = 0;

	if ( (f = fopen (file, "r")) )
	{
		while (fgets(cmd, countof(cmd)-1, f))
		{
			// Comments begin with //
			char *stop = cmd + strlen(cmd) - 1;
			char *comment = cmd;
			int inQuote = 0;

			if (*stop == '\n')
				*stop-- = 0;

			while (comment < stop)
			{
				if (*comment == '\"')
				{
					inQuote ^= 1;
				}
				else if (!inQuote && *comment == '/' && *(comment + 1) == '/')
				{
					break;
				}
				comment++;
			}
			if (comment == cmd)
			{ // Comment at line beginning
				continue;
			}
			else if (comment < stop)
			{ // Comment in middle of line
				*comment = 0;
			}
			if (exec == NULL)
			{
				exec = new FExecList;
			}
			exec->AddCommand(cmd, file);
		}
		if (!feof(f))
		{
			Printf("Error parsing \"%s\"\n", file);
		}
		fclose(f);
	}
	else
	{
		Printf ("Could not open \"%s\"\n", file);
	}
	return exec;
}